

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O0

void __thiscall density::lifo_array<MyStruct>::~lifo_array(lifo_array<MyStruct> *this)

{
  lifo_array<MyStruct> *this_local;
  
  destroy_elements();
  detail::LifoArrayImpl<MyStruct,_false>::~LifoArrayImpl
            (&this->super_LifoArrayImpl<MyStruct,_false>);
  return;
}

Assistant:

~lifo_array() { destroy_elements(std::is_trivially_destructible<TYPE>()); }